

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O0

void __thiscall UDMFParser::ParseThing(UDMFParser *this,FMapThing *th)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  DWORD DVar4;
  int iVar5;
  FDoomEdEntry *pFVar6;
  char *pcVar7;
  undefined1 local_f8 [8];
  line_t ld;
  maplinedef_t mld;
  FMapThingUserData local_44;
  FMapThingUserData ud;
  FName style;
  FName key;
  FString local_28;
  FString arg1str;
  FString arg0str;
  FMapThing *th_local;
  UDMFParser *this_local;
  
  FString::FString(&arg1str);
  FString::FString(&local_28);
  th->pitch = 0;
  th->roll = 0;
  th->RenderStyle = 0;
  *(undefined8 *)&th->FloatbobPhase = 0;
  (th->Scale).Y = 0.0;
  th->health = 0;
  th->score = 0;
  *(undefined8 *)&th->fillcolor = 0;
  (th->Scale).X = 0.0;
  th->Gravity = 0.0;
  th->Alpha = 0.0;
  th->args[2] = 0;
  th->args[3] = 0;
  *(undefined8 *)(th->args + 4) = 0;
  th->flags = 0;
  th->special = 0;
  th->args[0] = 0;
  th->args[1] = 0;
  th->angle = 0;
  th->SkillFilter = 0;
  th->ClassFilter = 0;
  th->EdNum = 0;
  th->info = (FDoomEdEntry *)0x0;
  (th->pos).Y = 0.0;
  (th->pos).Z = 0.0;
  *(undefined8 *)th = 0;
  (th->pos).X = 0.0;
  th->Gravity = 1.0;
  th->RenderStyle = 0xe;
  th->Alpha = -1.0;
  th->health = 1;
  th->FloatbobPhase = -1;
  FScanner::MustGetToken((FScanner *)this,0x7b);
  do {
    bVar2 = FScanner::CheckToken((FScanner *)this,0x7d);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      bVar2 = FString::IsNotEmpty(&arg1str);
      if ((bVar2) && ((bVar2 = P_IsACSSpecial(th->special), bVar2 || (th->special == 0)))) {
        FName::FName((FName *)mld.sidenum,&arg1str);
        iVar5 = FName::operator_cast_to_int((FName *)mld.sidenum);
        th->args[0] = -iVar5;
      }
      bVar2 = FString::IsNotEmpty(&local_28);
      if ((bVar2) && ((bVar2 = P_IsThingSpecial(th->special), bVar2 || (th->special == 0)))) {
        FName::FName((FName *)&mld.special,&local_28);
        iVar5 = FName::operator_cast_to_int((FName *)&mld.special);
        th->args[1] = -iVar5;
      }
      bVar2 = FName::operator==(&(this->super_UDMFParserBase).namespc,NAME_ZDoomTranslated);
      if (bVar2) {
        line_t::line_t((line_t *)local_f8);
        if (th->special != 0) {
          mld.v1 = (WORD)th->args[0];
          P_TranslateLineDef((line_t *)local_f8,(maplinedef_t *)((long)&ld.portaltransferred + 2),-1
                            );
          th->special = ld.flags;
          th->args[0] = ld.activation;
          th->args[1] = ld.special;
          *(undefined8 *)(th->args + 2) = ld.args._0_8_;
          th->args[4] = ld.args[2];
        }
      }
      else if ((this->isTranslated & 1U) != 0) {
        th->special = 0;
        memset(th->args,0,0x14);
      }
      FString::~FString(&local_28);
      FString::~FString(&arg1str);
      return;
    }
    UDMFParserBase::ParseKey((UDMFParserBase *)&ud.Value,SUB81(this,0),(bool *)0x0);
    iVar5 = FName::operator_cast_to_int((FName *)&ud.Value);
    switch(iVar5) {
    case 0x23:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      DVar4 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar7);
      th->fillcolor = DVar4;
      break;
    default:
      if (((this->super_UDMFParserBase).namespace_bits & 0x30U) != 0) {
        pcVar7 = FName::GetChars((FName *)&ud.Value);
        iVar5 = strncasecmp("user_",pcVar7,5);
        if (iVar5 == 0) {
          FMapThingUserData::FMapThingUserData(&local_44);
          FName::operator=(&local_44.Property,(FName *)&ud.Value);
          pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
          local_44.Value = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar7);
          TArray<FMapThingUserData,_FMapThingUserData>::Push(&MapThingsUserData,&local_44);
        }
      }
      break;
    case 0xdf:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar7);
      th->Alpha = dVar1;
      break;
    case 0xe0:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar7);
      th->angle = (short)iVar5;
      break;
    case 0xe4:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar7);
      th->health = iVar5;
      break;
    case 0xe5:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar7);
      th->pitch = (short)iVar5;
      break;
    case 0xe6:
      if (((this->super_UDMFParserBase).namespace_bits & 0x74U) != 0) {
        pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
        iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar7);
        th->special = iVar5;
      }
      break;
    case 0xea:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar7);
      (th->pos).X = dVar1;
      break;
    case 0xeb:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar7);
      (th->pos).Y = dVar1;
      break;
    case 0x10a:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar7);
      (th->pos).Z = dVar1;
      break;
    case 0x10b:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar7);
      th->EdNum = (short)iVar5;
      pFVar6 = TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::CheckKey
                         (&DoomEdMap,(int)th->EdNum);
      th->info = pFVar6;
      break;
    case 0x10c:
    case 0x10d:
    case 0x10e:
    case 0x10f:
    case 0x110:
      if (((this->super_UDMFParserBase).namespace_bits & 0x74U) != 0) {
        pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
        iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar7);
        iVar3 = FName::operator_cast_to_int((FName *)&ud.Value);
        th->args[iVar3 + -0x10c] = iVar5;
      }
      break;
    case 0x111:
      if (((this->super_UDMFParserBase).namespace_bits & 0x10U) != 0) {
        pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
        pcVar7 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar7);
        FString::operator=(&arg1str,pcVar7);
      }
      break;
    case 0x112:
      if (((this->super_UDMFParserBase).namespace_bits & 0x10U) != 0) {
        pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
        pcVar7 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar7);
        FString::operator=(&local_28,pcVar7);
      }
      break;
    case 0x113:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar7);
      th->thingid = iVar5;
      break;
    case 0x125:
    case 0x126:
    case 0x127:
    case 0x128:
    case 0x129:
    case 0x12a:
    case 299:
    case 300:
    case 0x12d:
    case 0x12e:
    case 0x12f:
    case 0x130:
    case 0x131:
    case 0x132:
    case 0x133:
    case 0x134:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      bVar2 = UDMFParserBase::CheckBool(&this->super_UDMFParserBase,pcVar7);
      if (bVar2) {
        iVar5 = FName::operator_cast_to_int((FName *)&ud.Value);
        th->SkillFilter = th->SkillFilter | (ushort)(1 << ((char)iVar5 - 0x25U & 0x1f));
      }
      else {
        iVar5 = FName::operator_cast_to_int((FName *)&ud.Value);
        th->SkillFilter = th->SkillFilter & ((ushort)(1 << ((char)iVar5 - 0x25U & 0x1f)) ^ 0xffff);
      }
      break;
    case 0x137:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&th->flags,8,pcVar7);
      break;
    case 0x138:
      if (((this->super_UDMFParserBase).namespace_bits & 0x74U) != 0) {
        pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&th->flags,0x10,pcVar7);
      }
      break;
    case 0x13a:
    case 0x13b:
    case 0x13c:
    case 0x13d:
    case 0x13e:
    case 0x13f:
    case 0x140:
    case 0x141:
    case 0x142:
    case 0x143:
    case 0x144:
    case 0x145:
    case 0x146:
    case 0x147:
    case 0x148:
    case 0x149:
      if (((this->super_UDMFParserBase).namespace_bits & 0x74U) != 0) {
        pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
        bVar2 = UDMFParserBase::CheckBool(&this->super_UDMFParserBase,pcVar7);
        if (bVar2) {
          iVar5 = FName::operator_cast_to_int((FName *)&ud.Value);
          th->ClassFilter = th->ClassFilter | (ushort)(1 << ((char)iVar5 - 0x3aU & 0x1f));
        }
        else {
          iVar5 = FName::operator_cast_to_int((FName *)&ud.Value);
          th->ClassFilter = th->ClassFilter & ((ushort)(1 << ((char)iVar5 - 0x3aU & 0x1f)) ^ 0xffff)
          ;
        }
      }
      break;
    case 0x14a:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&th->flags,0x100,pcVar7);
      break;
    case 0x14b:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&th->flags,0x200,pcVar7);
      break;
    case 0x14c:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&th->flags,0x400,pcVar7);
      break;
    case 0x14d:
      if (((this->super_UDMFParserBase).namespace_bits & 0x78U) != 0) {
        pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&th->flags,0x800,pcVar7);
      }
      break;
    case 0x14e:
      if (((this->super_UDMFParserBase).namespace_bits & 0x78U) != 0) {
        pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&th->flags,0x1000,pcVar7);
      }
      break;
    case 0x14f:
      if (((this->super_UDMFParserBase).namespace_bits & 0x71U) != 0) {
        pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&th->flags,0x2000,pcVar7);
      }
      break;
    case 0x150:
      if (((this->super_UDMFParserBase).namespace_bits & 0x78U) != 0) {
        pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&th->flags,0x2000,pcVar7);
      }
      break;
    case 0x151:
      if (((this->super_UDMFParserBase).namespace_bits & 0x78U) != 0) {
        pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&th->flags,0x4000,pcVar7);
      }
      break;
    case 0x152:
      if (((this->super_UDMFParserBase).namespace_bits & 0x70U) != 0) {
        pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&th->flags,0x80000,pcVar7);
      }
      break;
    case 0x153:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar7);
      th->score = iVar5;
      break;
    case 0x154:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar7);
      th->roll = (short)iVar5;
      break;
    case 0x155:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar7);
      (th->Scale).Y = dVar1;
      (th->Scale).X = dVar1;
      break;
    case 0x156:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar7);
      (th->Scale).X = dVar1;
      break;
    case 0x157:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar7);
      (th->Scale).Y = dVar1;
      break;
    case 0x158:
      if (((this->super_UDMFParserBase).namespace_bits & 0x30U) != 0) {
        pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
        iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar7);
        th->FloatbobPhase = iVar5;
      }
      break;
    case 0x170:
      if (((this->super_UDMFParserBase).namespace_bits & 0x30U) != 0) {
        pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
        iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar7);
        th->Conversation = iVar5;
      }
      break;
    case 0x18e:
      if (((this->super_UDMFParserBase).namespace_bits & 0x30U) != 0) {
        pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
        dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar7);
        th->Gravity = dVar1;
      }
      break;
    case 0x1b2:
      pcVar7 = FName::operator_cast_to_char_((FName *)&ud.Value);
      pcVar7 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar7);
      FName::FName(&ud.Property,pcVar7);
      iVar5 = FName::operator_cast_to_int(&ud.Property);
      if (iVar5 == 0) {
        th->RenderStyle = 0;
      }
      else if (iVar5 == 0x13) {
LAB_006e0ce3:
        th->RenderStyle = 7;
      }
      else if (iVar5 == 0x15) {
        th->RenderStyle = 2;
      }
      else if (iVar5 == 0x17) {
        th->RenderStyle = 5;
      }
      else if (iVar5 == 0x18) {
        th->RenderStyle = 0xc;
      }
      else if (iVar5 == 0x19) {
        th->RenderStyle = 1;
      }
      else if (iVar5 == 0x1a) {
        th->RenderStyle = 3;
      }
      else if (iVar5 == 0x1b) {
        th->RenderStyle = 4;
      }
      else {
        if (iVar5 == 0x1c) goto LAB_006e0ce3;
        if (iVar5 == 0x1d) {
          th->RenderStyle = 8;
        }
        else if (iVar5 == 0x1e) {
          th->RenderStyle = 0xd;
        }
        else if (iVar5 == 0x1f) {
          th->RenderStyle = 9;
        }
        else if (iVar5 == 0x20) {
          th->RenderStyle = 10;
        }
        else if (iVar5 - 0x21U < 2) {
          th->RenderStyle = 0xb;
        }
        else if (iVar5 == 0x14d) {
          th->RenderStyle = 6;
        }
      }
    }
  } while( true );
}

Assistant:

void ParseThing(FMapThing *th)
	{
		FString arg0str, arg1str;

		memset(th, 0, sizeof(*th));
		th->Gravity = 1;
		th->RenderStyle = STYLE_Count;
		th->Alpha = -1;
		th->health = 1;
		th->FloatbobPhase = -1;
		sc.MustGetToken('{');
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch(key)
			{
			case NAME_Id:
				th->thingid = CheckInt(key);
				break;

			case NAME_X:
				th->pos.X = CheckFloat(key);
				break;

			case NAME_Y:
				th->pos.Y = CheckFloat(key);
				break;

			case NAME_Height:
				th->pos.Z = CheckFloat(key);
				break;

			case NAME_Angle:
				th->angle = (short)CheckInt(key);
				break;

			case NAME_Type:
				th->EdNum = (short)CheckInt(key);
				th->info = DoomEdMap.CheckKey(th->EdNum);
				break;

			case NAME_Conversation:
				CHECK_N(Zd | Zdt)
				th->Conversation = CheckInt(key);
				break;

			case NAME_Special:
				CHECK_N(Hx | Zd | Zdt | Va)
				th->special = CheckInt(key);
				break;

			case NAME_Gravity:
				CHECK_N(Zd | Zdt)
				th->Gravity = CheckFloat(key);
				break;

			case NAME_Arg0:
			case NAME_Arg1:
			case NAME_Arg2:
			case NAME_Arg3:
			case NAME_Arg4:
				CHECK_N(Hx | Zd | Zdt | Va)
				th->args[int(key)-int(NAME_Arg0)] = CheckInt(key);
				break;

			case NAME_Arg0Str:
				CHECK_N(Zd);
				arg0str = CheckString(key);
				break;

			case NAME_Arg1Str:
				CHECK_N(Zd);
				arg1str = CheckString(key);
				break;

			case NAME_Skill1:
			case NAME_Skill2:
			case NAME_Skill3:
			case NAME_Skill4:
			case NAME_Skill5:
			case NAME_Skill6:
			case NAME_Skill7:
			case NAME_Skill8:
			case NAME_Skill9:
			case NAME_Skill10:
			case NAME_Skill11:
			case NAME_Skill12:
			case NAME_Skill13:
			case NAME_Skill14:
			case NAME_Skill15:
			case NAME_Skill16:
				if (CheckBool(key)) th->SkillFilter |= (1<<(int(key)-NAME_Skill1));
				else th->SkillFilter &= ~(1<<(int(key)-NAME_Skill1));
				break;

			case NAME_Class1:
			case NAME_Class2:
			case NAME_Class3:
			case NAME_Class4:
			case NAME_Class5:
			case NAME_Class6:
			case NAME_Class7:
			case NAME_Class8:
			case NAME_Class9:
			case NAME_Class10:
			case NAME_Class11:
			case NAME_Class12:
			case NAME_Class13:
			case NAME_Class14:
			case NAME_Class15:
			case NAME_Class16:
				CHECK_N(Hx | Zd | Zdt | Va)
				if (CheckBool(key)) th->ClassFilter |= (1<<(int(key)-NAME_Class1));
				else th->ClassFilter &= ~(1<<(int(key)-NAME_Class1));
				break;

			case NAME_Ambush:
				Flag(th->flags, MTF_AMBUSH, key); 
				break;

			case NAME_Dormant:
				CHECK_N(Hx | Zd | Zdt | Va)
				Flag(th->flags, MTF_DORMANT, key); 
				break;

			case NAME_Single:
				Flag(th->flags, MTF_SINGLE, key); 
				break;

			case NAME_Coop:
				Flag(th->flags, MTF_COOPERATIVE, key); 
				break;

			case NAME_Dm:
				Flag(th->flags, MTF_DEATHMATCH, key); 
				break;

			case NAME_Translucent:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(th->flags, MTF_SHADOW, key); 
				break;

			case NAME_Invisible:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(th->flags, MTF_ALTSHADOW, key); 
				break;

			case NAME_Friend:	// This maps to Strife's friendly flag
				CHECK_N(Dm | Zd | Zdt | Va)
				Flag(th->flags, MTF_FRIENDLY, key); 
				break;

			case NAME_Strifeally:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(th->flags, MTF_FRIENDLY, key); 
				break;

			case NAME_Standing:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(th->flags, MTF_STANDSTILL, key); 
				break;

			case NAME_Countsecret:
				CHECK_N(Zd | Zdt | Va)
				Flag(th->flags, MTF_SECRET, key); 
				break;

			case NAME_Floatbobphase:
				CHECK_N(Zd | Zdt)
				th->FloatbobPhase = CheckInt(key);
				break;

			case NAME_Renderstyle:
				{
				FName style = CheckString(key);
				switch (style)
				{
				case NAME_None:
					th->RenderStyle = STYLE_None;
					break;
				case NAME_Normal:
					th->RenderStyle = STYLE_Normal;
					break;
				case NAME_Fuzzy:
					th->RenderStyle = STYLE_Fuzzy;
					break;
				case NAME_SoulTrans:
					th->RenderStyle = STYLE_SoulTrans;
					break;
				case NAME_OptFuzzy:
					th->RenderStyle = STYLE_OptFuzzy;
					break;
				case NAME_Stencil:
					th->RenderStyle = STYLE_Stencil;
					break;
				case NAME_AddStencil:
					th->RenderStyle = STYLE_AddStencil;
					break;
				case NAME_Translucent:
					th->RenderStyle = STYLE_Translucent;
					break;
				case NAME_Add:
				case NAME_Additive:
					th->RenderStyle = STYLE_Add;
					break;
				case NAME_Shaded:
					th->RenderStyle = STYLE_Shaded;
					break;
				case NAME_AddShaded:
					th->RenderStyle = STYLE_AddShaded;
					break;
				case NAME_TranslucentStencil:
					th->RenderStyle = STYLE_TranslucentStencil;
					break;
				case NAME_Shadow:
					th->RenderStyle = STYLE_Shadow;
					break;
				case NAME_Subtract:
				case NAME_Subtractive:
					th->RenderStyle = STYLE_Subtract;
					break;
				default:
					break;
				}
				}
				break;

			case NAME_Alpha:
				th->Alpha = CheckFloat(key);
				break;

			case NAME_FillColor:
				th->fillcolor = CheckInt(key);
				break;

			case NAME_Health:
				th->health = CheckInt(key);
				break;

			case NAME_Score:
				th->score = CheckInt(key);
				break;

			case NAME_Pitch:
				th->pitch = (short)CheckInt(key);
				break;

			case NAME_Roll:
				th->roll = (short)CheckInt(key);
				break;

			case NAME_ScaleX:
				th->Scale.X = CheckFloat(key);
				break;

			case NAME_ScaleY:
				th->Scale.Y = CheckFloat(key);
				break;

			case NAME_Scale:
				th->Scale.X = th->Scale.Y = CheckFloat(key);
				break;

			default:
				CHECK_N(Zd | Zdt)
				if (0 == strnicmp("user_", key.GetChars(), 5))
				{ // Custom user key - Sets an actor's user variable directly
					FMapThingUserData ud;
					ud.Property = key;
					ud.Value = CheckInt(key);
					MapThingsUserData.Push(ud);
				}
				break;
			}
		}
		if (arg0str.IsNotEmpty() && (P_IsACSSpecial(th->special) || th->special == 0))
		{
			th->args[0] = -FName(arg0str);
		}
		if (arg1str.IsNotEmpty() && (P_IsThingSpecial(th->special) || th->special == 0))
		{
			th->args[1] = -FName(arg1str);
		}
		// Thing specials are only valid in namespaces with Hexen-type specials
		// and in ZDoomTranslated - which will use the translator on them.
		if (namespc == NAME_ZDoomTranslated)
		{
			maplinedef_t mld;
			line_t ld;

			if (th->special != 0)	// if special is 0, keep the args (e.g. for bridge things)
			{
				// The trigger type is ignored here.
				mld.flags = 0;
				mld.special = th->special;
				mld.tag = th->args[0];
				P_TranslateLineDef(&ld, &mld);
				th->special = ld.special;
				memcpy(th->args, ld.args, sizeof (ld.args));
			}
		}
		else if (isTranslated)
		{
			th->special = 0;
			memset(th->args, 0, sizeof (th->args));
		}
	}